

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

int floatx80_is_signaling_nan_m68k(floatx80 a,float_status *status)

{
  return (int)((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) !=
                (undefined1  [16])0x0 && (~a._8_4_ & 0x7fff) == 0) &&
              ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0)
  ;
}

Assistant:

int floatx80_is_signaling_nan(floatx80 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    if (snan_bit_is_one(status)) {
        return ((a.high & 0x7FFF) == 0x7FFF)
            && ((a.low << 1) >= 0x8000000000000000ULL);
    } else {
        uint64_t aLow;

        aLow = a.low & ~UINT64_C(0x4000000000000000);
        return ((a.high & 0x7FFF) == 0x7FFF)
            && (uint64_t)(aLow << 1)
            && (a.low == aLow);
    }
#endif
}